

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O1

int cmdline_add_arg(archive_cmdline *data,char *arg)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  
  if (data->path == (char *)0x0) {
    iVar4 = -0x19;
  }
  else {
    ppcVar2 = (char **)realloc(data->argv,(long)data->argc * 8 + 0x10);
    iVar4 = -0x1e;
    if (ppcVar2 != (char **)0x0) {
      data->argv = ppcVar2;
      pcVar3 = strdup(arg);
      iVar1 = data->argc;
      ppcVar2[iVar1] = pcVar3;
      if (pcVar3 != (char *)0x0) {
        data->argc = iVar1 + 1;
        ppcVar2[(long)iVar1 + 1] = (char *)0x0;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
cmdline_add_arg(struct archive_cmdline *data, const char *arg)
{
	char **newargv;

	if (data->path == NULL)
		return (ARCHIVE_FAILED);

	newargv = realloc(data->argv, (data->argc + 2) * sizeof(char *));
	if (newargv == NULL)
		return (ARCHIVE_FATAL);
	data->argv = newargv;
	data->argv[data->argc] = strdup(arg);
	if (data->argv[data->argc] == NULL)
		return (ARCHIVE_FATAL);
	/* Set the terminator of argv. */
	data->argv[++data->argc] = NULL;
	return (ARCHIVE_OK);
}